

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O0

void bench_ecdh_setup(void *arg)

{
  int iVar1;
  undefined8 *in_RDI;
  uchar point [33];
  bench_ecdh_data *data;
  int i;
  undefined1 auStack_48 [48];
  undefined8 *local_18;
  int local_c;
  
  local_18 = in_RDI;
  memcpy(auStack_48,&DAT_00106370,0x21);
  for (local_c = 0; local_c < 0x20; local_c = local_c + 1) {
    *(char *)((long)local_18 + (long)local_c + 0x48) = (char)local_c + '\x01';
  }
  iVar1 = secp256k1_ec_pubkey_parse(*local_18,local_18 + 1,auStack_48,0x21);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ecdh/bench_impl.h"
            ,0x20,
            "test condition failed: secp256k1_ec_pubkey_parse(data->ctx, &data->point, point, sizeof(point)) == 1"
           );
    abort();
  }
  return;
}

Assistant:

static void bench_ecdh_setup(void* arg) {
    int i;
    bench_ecdh_data *data = (bench_ecdh_data*)arg;
    const unsigned char point[] = {
        0x03,
        0x54, 0x94, 0xc1, 0x5d, 0x32, 0x09, 0x97, 0x06,
        0xc2, 0x39, 0x5f, 0x94, 0x34, 0x87, 0x45, 0xfd,
        0x75, 0x7c, 0xe3, 0x0e, 0x4e, 0x8c, 0x90, 0xfb,
        0xa2, 0xba, 0xd1, 0x84, 0xf8, 0x83, 0xc6, 0x9f
    };

    for (i = 0; i < 32; i++) {
        data->scalar[i] = i + 1;
    }
    CHECK(secp256k1_ec_pubkey_parse(data->ctx, &data->point, point, sizeof(point)) == 1);
}